

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O3

void stack_head_delete(StackHead *self,StackNodeArray *pool,SubtreePool *subtree_pool)

{
  StackSummary *pSVar1;
  
  if (self->node != (StackNode *)0x0) {
    if ((self->last_external_token).ptr != (SubtreeHeapData *)0x0) {
      ts_subtree_release(subtree_pool,self->last_external_token);
    }
    pSVar1 = self->summary;
    if (pSVar1 != (StackSummary *)0x0) {
      free(pSVar1->contents);
      pSVar1->contents = (StackSummaryEntry *)0x0;
      pSVar1->size = 0;
      pSVar1->capacity = 0;
      free(self->summary);
    }
    stack_node_release(self->node,pool,subtree_pool);
    return;
  }
  return;
}

Assistant:

static void stack_head_delete(StackHead *self, StackNodeArray *pool, SubtreePool *subtree_pool) {
  if (self->node) {
    if (self->last_external_token.ptr) {
      ts_subtree_release(subtree_pool, self->last_external_token);
    }
    if (self->summary) {
      array_delete(self->summary);
      ts_free(self->summary);
    }
    stack_node_release(self->node, pool, subtree_pool);
  }
}